

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void free_mongen_override(mon_gen_override *or)

{
  mon_gen_tuple *pmVar1;
  mon_gen_tuple *prev;
  mon_gen_tuple *mt;
  mon_gen_override *or_local;
  
  if (or != (mon_gen_override *)0x0) {
    prev = or->gen_chances;
    while (prev != (mon_gen_tuple *)0x0) {
      pmVar1 = prev->next;
      free(prev);
      prev = pmVar1;
    }
    free(or);
  }
  return;
}

Assistant:

static void free_mongen_override(struct mon_gen_override *or)
{
	struct mon_gen_tuple *mt;
	struct mon_gen_tuple *prev;

	if (!or)
	    return;

	mt = or->gen_chances;
	while (mt) {
	    prev = mt;
	    mt = mt->next;
	    free(prev);
	}

	free(or);
}